

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  char *zRight;
  int iVar1;
  char *in_RDX;
  int *in_RSI;
  char *zAs;
  char *zCol;
  int i;
  int local_24;
  
  if (*in_RDX == ';') {
    zRight = *(char **)(in_RDX + 8);
    for (local_24 = 0; local_24 < *in_RSI; local_24 = local_24 + 1) {
      if ((*(char **)(in_RSI + (long)local_24 * 8 + 4) != (char *)0x0) &&
         (iVar1 = sqlite3StrICmp(*(char **)(in_RSI + (long)local_24 * 8 + 4),zRight), iVar1 == 0)) {
        return local_24 + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    char *zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      char *zAs = pEList->a[i].zName;
      if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
        return i+1;
      }
    }
  }
  return 0;
}